

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_eb8f1::preprocessor<baryonyx::raw_problem>::constraints_exclude_copy
          (preprocessor<baryonyx::raw_problem> *this,
          vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *mapping,
          vector<int,_std::allocator<int>_> *constraints_size,
          vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *constraints,
          vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *copy)

{
  int *piVar1;
  size_t *psVar2;
  double *__args_1;
  pointer piVar3;
  pointer piVar4;
  pointer pcVar5;
  pointer piVar6;
  int *piVar7;
  char *pcVar8;
  function_element *elem;
  int *__args;
  ulong uVar9;
  
  piVar3 = (constraints_size->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  piVar4 = (constraints_size->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar9 = 0; uVar9 != (((long)piVar3 - (long)piVar4) / 0x30 & 0xffffffffU); uVar9 = uVar9 + 1)
  {
    if (1 < (&((mapping->
               super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>).
               _M_impl.super__Vector_impl_data._M_start)->first)[uVar9]) {
      std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::emplace_back<>
                (constraints);
      pcVar5 = (constraints->
               super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      piVar6 = (constraints_size->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar5[-1].id = piVar6[uVar9 * 0xc + 0xb];
      psVar2 = (size_t *)(piVar6 + uVar9 * 0xc);
      pcVar8 = (char *)psVar2[1];
      pcVar5[-1].label._M_len = *psVar2;
      pcVar5[-1].label._M_str = pcVar8;
      piVar6 = (constraints_size->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      (constraints->super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>)
      ._M_impl.super__Vector_impl_data._M_finish[-1].value = piVar6[uVar9 * 0xc + 10];
      piVar7 = *(int **)(piVar6 + uVar9 * 0xc + 6);
      for (__args = *(int **)(piVar6 + uVar9 * 0xc + 4); __args != piVar7; __args = __args + 2) {
        __args_1 = &(this->ctx->parameters).time_limit + __args[1];
        if (*(int *)__args_1 < 0) {
          if (*(char *)((long)__args_1 + 4) == '\x01') {
            piVar1 = &(constraints->
                      super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                      )._M_impl.super__Vector_impl_data._M_finish[-1].value;
            *piVar1 = *piVar1 - *__args;
          }
        }
        else {
          std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>::
          emplace_back<int_const&,int_const&>
                    ((vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>
                      *)&(constraints->
                         super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                         )._M_impl.super__Vector_impl_data._M_finish[-1].elements,__args,
                     (int *)__args_1);
        }
      }
    }
  }
  return;
}

Assistant:

void constraints_exclude_copy(
      const std::vector<std::pair<int, bool>>& mapping,
      const std::vector<int>& constraints_size,
      const std::vector<bx::constraint>& constraints,
      std::vector<bx::constraint>& copy) const
    {
        for (int i = 0, e = bx::length(constraints); i != e; ++i) {

            // Remaining constraints with one element are undecidable (can be 0
            // or 1) but useless in constraints (e.g. x <= 1) list. We remove
            // it.

            if (constraints_size[i] <= 1)
                continue;

            copy.emplace_back();
            copy.back().id = constraints[i].id;
            copy.back().label = constraints[i].label;
            copy.back().value = constraints[i].value;

            for (const auto& elem : constraints[i].elements) {
                if (mapping[elem.variable_index].first >= 0) {
                    copy.back().elements.emplace_back(
                      elem.factor, mapping[elem.variable_index].first);
                } else {
                    if (mapping[elem.variable_index].second == true) {
                        copy.back().value -= elem.factor;
                    }
                }
            }
        }
    }